

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O0

SizeOp asmjit::v1_14::a64::armElementTypeToSizeOp
                 (uint32_t vecOpType,RegType regType,VecElementType elementType)

{
  uint32_t uVar1;
  uint in_EDX;
  RegType in_SIL;
  uint in_EDI;
  SizeOp op;
  size_t index;
  SizeOpTable *table;
  SizeOpMap *map;
  SizeOp modifiedOp;
  char *in_stack_000003a0;
  int in_stack_000003ac;
  char *in_stack_000003b0;
  uint local_58;
  uint local_50;
  uint local_4c;
  ulong local_48;
  undefined1 *local_40;
  byte *local_38;
  uint local_30;
  SizeOp local_21;
  uint *local_20;
  uint *local_18;
  byte local_b;
  ushort local_a;
  byte *local_8;
  
  if (0x16 < in_EDI) {
    DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
  }
  if (in_EDX < 8) {
    local_38 = sizeOpMap + (ulong)in_EDI * 4;
    local_40 = sizeOpTable + (ulong)*local_38 * 0x28;
    local_30 = in_EDX;
    local_4c = diff(in_SIL,kARM_VecB);
    uVar1 = diff(kARM_VecQ,kARM_VecB);
    local_50 = uVar1 + 1;
    local_18 = &local_4c;
    local_20 = &local_50;
    local_58 = local_50;
    if (local_4c <= local_50) {
      local_58 = local_4c;
    }
    local_48 = (ulong)(local_58 << 3 | local_30);
    local_b = local_40[local_48];
    local_21.value = local_b & local_38[1];
    local_a = *(ushort *)(local_38 + 2);
    local_8 = &local_b;
    if (((uint)local_a & 1 << (local_b & 0x1f)) == 0) {
      SizeOp::makeInvalid(&local_21);
    }
    return (SizeOp)local_21.value;
  }
  DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
}

Assistant:

static inline SizeOp armElementTypeToSizeOp(uint32_t vecOpType, RegType regType, VecElementType elementType) noexcept {
  // Instruction data or Assembler is wrong if this triggers an assertion failure.
  ASMJIT_ASSERT(vecOpType < InstDB::kVO_Count);
  // ElementType uses 3 bits in the operand signature, it should never overflow.
  ASMJIT_ASSERT(uint32_t(elementType) <= 0x7u);

  const SizeOpMap& map = sizeOpMap[vecOpType];
  const SizeOpTable& table = sizeOpTable[map.tableId];

  size_t index = (Support::min<uint32_t>(diff(regType, RegType::kARM_VecB), diff(RegType::kARM_VecV, RegType::kARM_VecB) + 1) << 3) | uint32_t(elementType);
  SizeOp op = table.array[index];
  SizeOp modifiedOp { uint8_t(op.value & map.sizeOpMask) };

  if (!Support::bitTest(map.acceptMask, op.value))
    modifiedOp.makeInvalid();

  return modifiedOp;
}